

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS
ref_node_tri_projection(REF_NODE ref_node,REF_INT *nodes,REF_DBL *xyz,REF_DBL *projection)

{
  uint uVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double local_98;
  double local_88;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL vol;
  REF_DBL m13;
  REF_DBL m12;
  REF_DBL m11;
  REF_DBL *d;
  REF_DBL *c;
  REF_DBL *b;
  REF_DBL *a;
  REF_DBL area;
  REF_DBL *projection_local;
  REF_DBL *xyz_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  area = (REF_DBL)projection;
  projection_local = xyz;
  xyz_local = (REF_DBL *)nodes;
  nodes_local = &ref_node->n;
  uVar1 = ref_node_tri_area(ref_node,nodes,(REF_DBL *)&a);
  if (uVar1 == 0) {
    pdVar2 = (double *)(*(long *)(nodes_local + 0xe) + (long)(*(int *)xyz_local * 0xf) * 8);
    pdVar3 = (double *)
             (*(long *)(nodes_local + 0xe) + (long)(*(int *)((long)xyz_local + 4) * 0xf) * 8);
    pdVar4 = (double *)(*(long *)(nodes_local + 0xe) + (long)(*(int *)(xyz_local + 1) * 0xf) * 8);
    dVar5 = -(((*pdVar2 - *projection_local) *
               ((pdVar3[1] - projection_local[1]) * (pdVar4[2] - projection_local[2]) +
               -((pdVar4[1] - projection_local[1]) * (pdVar3[2] - projection_local[2]))) -
              (pdVar2[1] - projection_local[1]) *
              ((*pdVar3 - *projection_local) * (pdVar4[2] - projection_local[2]) +
              -((*pdVar4 - *projection_local) * (pdVar3[2] - projection_local[2])))) +
             (pdVar2[2] - projection_local[2]) *
             ((*pdVar3 - *projection_local) * (pdVar4[1] - projection_local[1]) +
             -((*pdVar4 - *projection_local) * (pdVar3[1] - projection_local[1])))) / 6.0;
    if ((double)a * 1e+20 <= 0.0) {
      local_88 = -((double)a * 1e+20);
    }
    else {
      local_88 = (double)a * 1e+20;
    }
    local_98 = dVar5;
    if (dVar5 <= 0.0) {
      local_98 = -dVar5;
    }
    if (local_88 <= local_98) {
      *(undefined8 *)area = 0;
      printf("%s: %d: %s: div zero vol %.18e area %.18e\n",dVar5,a,
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xc14,
             "ref_node_tri_projection");
      ref_node_local._4_4_ = 4;
    }
    else {
      *(double *)area = (dVar5 / (double)a) * 3.0;
      ref_node_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xc01,
           "ref_node_tri_projection",(ulong)uVar1,"area");
    ref_node_local._4_4_ = uVar1;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_projection(REF_NODE ref_node, REF_INT *nodes,
                                           REF_DBL *xyz, REF_DBL *projection) {
  REF_DBL area;
  REF_DBL *a, *b, *c, *d;
  REF_DBL m11, m12, m13;
  REF_DBL vol;
  RSS(ref_node_tri_area(ref_node, nodes, &area), "area");

  a = ref_node_xyz_ptr(ref_node, nodes[0]);
  b = ref_node_xyz_ptr(ref_node, nodes[1]);
  c = ref_node_xyz_ptr(ref_node, nodes[2]);
  d = xyz;

  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  vol = -(m11 - m12 + m13) / 6.0;

  if (ref_math_divisible(vol, area)) {
    *projection = 3.0 * (vol / area);
  } else {
    *projection = 0.0;
    printf("%s: %d: %s: div zero vol %.18e area %.18e\n", __FILE__, __LINE__,
           __func__, vol, area);
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}